

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_kmgmt.c
# Opt level: O0

int rsa_import(void *keydata,int selection,OSSL_PARAM *params)

{
  int iVar1;
  RSA_PSS_PARAMS_30 *pRVar2;
  OSSL_PARAM *in_RDX;
  uint in_ESI;
  RSA *in_RDI;
  int pss_defaults_set;
  int ok;
  int rsa_type;
  RSA *rsa;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  bool bVar3;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  undefined4 local_30;
  RSA *params_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int rsa_type_00;
  
  local_30 = 1;
  uVar4 = 0;
  params_00 = in_RDI;
  iVar1 = ossl_prov_is_running();
  if ((iVar1 == 0) || (in_RDI == (RSA *)0x0)) {
    local_30 = 0;
  }
  else if ((in_ESI & 0x83) == 0) {
    local_30 = 0;
  }
  else {
    iVar1 = RSA_test_flags(in_RDI,0xf000);
    if ((in_ESI & 0x80) != 0) {
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 & 0xffffff;
      pRVar2 = ossl_rsa_get0_pss_params_30(in_RDI);
      rsa_type_00 = (int)((ulong)pRVar2 >> 0x20);
      ossl_rsa_get0_libctx(in_RDI);
      iVar1 = pss_params_fromdata((RSA_PSS_PARAMS_30 *)CONCAT44(uVar4,in_stack_ffffffffffffffc8),
                                  (int *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),in_RDX,
                                  rsa_type_00,
                                  (OSSL_LIB_CTX *)
                                  CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      local_30 = (uint)(iVar1 != 0);
    }
    if ((in_ESI & 3) != 0) {
      bVar3 = false;
      if (local_30 != 0) {
        iVar1 = ossl_rsa_fromdata((RSA *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),(OSSL_PARAM *)params_00
                                 );
        bVar3 = iVar1 != 0;
      }
      local_30 = (uint)bVar3;
    }
  }
  return local_30;
}

Assistant:

static int rsa_import(void *keydata, int selection, const OSSL_PARAM params[])
{
    RSA *rsa = keydata;
    int rsa_type;
    int ok = 1;
    int pss_defaults_set = 0;

    if (!ossl_prov_is_running() || rsa == NULL)
        return 0;

    if ((selection & RSA_POSSIBLE_SELECTIONS) == 0)
        return 0;

    rsa_type = RSA_test_flags(rsa, RSA_FLAG_TYPE_MASK);

    if ((selection & OSSL_KEYMGMT_SELECT_OTHER_PARAMETERS) != 0)
        ok = ok && pss_params_fromdata(ossl_rsa_get0_pss_params_30(rsa),
                                       &pss_defaults_set,
                                       params, rsa_type,
                                       ossl_rsa_get0_libctx(rsa));
    if ((selection & OSSL_KEYMGMT_SELECT_KEYPAIR) != 0)
        ok = ok && ossl_rsa_fromdata(rsa, params);

    return ok;
}